

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

double vera::sqrt(double __x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  undefined4 *puVar5;
  long *in_RDI;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  undefined4 local_18;
  int i;
  int total;
  Image *_image_local;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))();
  iVar2 = (**(code **)(*in_RDI + 0x38))();
  iVar3 = (**(code **)(*in_RDI + 0x40))();
  dVar7 = extraout_XMM0_Qa;
  for (local_18 = 0; local_18 < iVar1 * iVar2 * iVar3; local_18 = local_18 + 1) {
    puVar4 = (uint *)(**(code **)(*in_RDI + 0x60))(in_RDI,local_18);
    dVar6 = std::sqrt((double)(ulong)*puVar4);
    puVar5 = (undefined4 *)(**(code **)(*in_RDI + 0x60))(in_RDI,local_18);
    dVar7 = (double)((ulong)dVar6 & 0xffffffff);
    *puVar5 = SUB84(dVar6,0);
  }
  return dVar7;
}

Assistant:

void sqrt(Image& _image) {
    int total = _image.getWidth() * _image.getHeight() * _image.getChannels();
    for (int i = 0; i < total; i++)
        _image[i] = std::sqrt(_image[i]);
}